

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soa_chunk.c
# Opt level: O0

void soa_chunk_free(soa_chunk_t *chunk,void *p,size_t blockSize)

{
  ulong uVar1;
  ulong uVar2;
  uchar *pChar;
  size_t newFirstAvailableBlock;
  size_t pOffset;
  size_t blockSize_local;
  void *p_local;
  soa_chunk_t *chunk_local;
  
  if (p < chunk->blockData) {
    __assert_fail("pChar >= chunk->blockData",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/cutil/src/soa_chunk.c"
                  ,0x35,"void soa_chunk_free(soa_chunk_t *, void *, size_t)");
  }
  uVar1 = (long)p - (long)chunk->blockData;
  if (uVar1 % blockSize != 0) {
    __assert_fail("pOffset % blockSize == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/cutil/src/soa_chunk.c"
                  ,0x37,"void soa_chunk_free(soa_chunk_t *, void *, size_t)");
  }
  *(uchar *)p = chunk->firstBlock;
  uVar2 = uVar1 / blockSize;
  if (uVar2 * blockSize - uVar1 != 0) {
    __assert_fail("newFirstAvailableBlock*blockSize == pOffset",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/cutil/src/soa_chunk.c"
                  ,0x3a,"void soa_chunk_free(soa_chunk_t *, void *, size_t)");
  }
  if (uVar2 < 0x100) {
    chunk->firstBlock = (uchar)uVar2;
    chunk->freeBlocks = chunk->freeBlocks + '\x01';
    return;
  }
  __assert_fail("newFirstAvailableBlock < 256",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/cutil/src/soa_chunk.c"
                ,0x3b,"void soa_chunk_free(soa_chunk_t *, void *, size_t)");
}

Assistant:

void soa_chunk_free( soa_chunk_t *chunk,void *p, size_t blockSize )
{
  size_t pOffset;
  size_t newFirstAvailableBlock;
  unsigned char *pChar = ((unsigned char*)p);
  assert( pChar >= chunk->blockData); //assert that p belongs to this chunk
  pOffset = pChar - chunk->blockData;
  assert(pOffset % blockSize == 0); //assert that p is aligned to the first byte of a block
  *pChar = chunk->firstBlock;       //store index of first available block in byte 0 of the freed block
  newFirstAvailableBlock = pOffset / blockSize;
  assert(newFirstAvailableBlock*blockSize == pOffset); //check for truncation error
  assert(newFirstAvailableBlock < 256); //check for index out of bounds error  
  chunk->firstBlock = (unsigned char) newFirstAvailableBlock;
  chunk->freeBlocks++;
}